

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O1

_Bool borg_target_unknown_wall(wchar_t y,wchar_t x)

{
  uint8_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  _Bool _Var5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  borg_grid *pbVar9;
  bool bVar10;
  bool bVar11;
  wchar_t n_y;
  wchar_t n_x;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t local_34;
  
  local_34 = y;
  pcVar6 = format("# Perhaps wall near targetted location (%d,%d)",y,x);
  borg_note(pcVar6);
  lVar8 = (long)borg.c.x;
  local_38 = borg.c.x;
  lVar7 = (long)borg.c.y;
  local_3c = borg.c.y;
  uVar1 = borg_grids[lVar7 + 1][lVar8].feat;
  bVar11 = true;
  bVar10 = true;
  if ((((uVar1 == '\x01') && (*(char *)((&DAT_002f9138)[lVar7] + lVar8 * 0xc) == '\x01')) &&
      ((borg_grids[lVar7 + 2][lVar8].feat == '\x01' ||
       (*(char *)(*(long *)(borg_view_x + lVar7 * 8 + 0x2320) + lVar8 * 0xc) == '\x01')))) &&
     (borg_grids[lVar7][lVar8 + 1].feat != '\x01')) {
    bVar10 = borg_grids[lVar7][lVar8 + -1].feat == '\x01';
  }
  pbVar9 = borg_grids[lVar7];
  if ((pbVar9[lVar8 + 1].feat == '\x01') && (pbVar9[lVar8 + -1].feat == '\x01')) {
    if (pbVar9[lVar8 + 2].feat == '\x01') {
      if (uVar1 == '\x01') goto LAB_002406c4;
    }
    else if ((uVar1 == '\x01') || (pbVar9[lVar8 + -2].feat != '\x01')) goto LAB_002406c4;
    bVar11 = *(char *)((&DAT_002f9138)[lVar7] + lVar8 * 0xc) == '\x01';
  }
LAB_002406c4:
  do {
    wVar3 = local_38;
    wVar2 = local_3c;
    lVar8 = (long)local_3c;
    lVar7 = (long)local_38;
    _Var5 = flag_has_dbg(r_info[borg_kills[borg_grids[lVar8][lVar7].kill].r_idx].flags,0xb,0x2e,
                         "r_ptr->flags","RF_PASS_WALL");
    wVar4 = local_34;
    if (_Var5) {
      pcVar6 = format("# Guessing wall (%d,%d) under ghostly target (%d,%d)",(ulong)(uint)wVar2,
                      (ulong)(uint)wVar3,(ulong)(uint)wVar2,(ulong)(uint)wVar3);
      borg_note(pcVar6);
      pbVar9 = borg_grids[lVar8] + lVar7;
LAB_0024082a:
      pbVar9->feat = '\x15';
      return true;
    }
    if (((borg_grids[lVar8][lVar7].feat == '\0') && (!(bool)(~bVar11 & wVar2 == borg.c.y))) &&
       (!(bool)(~bVar10 & wVar3 == borg.c.x))) {
      pcVar6 = format("# Guessing wall (%d,%d) near target (%d,%d)",(ulong)(uint)wVar2,
                      (ulong)(uint)wVar3,(ulong)(uint)local_34,x);
      borg_note(pcVar6);
LAB_00240822:
      pbVar9 = borg_grids[lVar8] + lVar7;
      goto LAB_0024082a;
    }
    if (wVar2 == local_34 && wVar3 == x) {
      borg_inc_motion(&local_3c,&local_38,local_34,x,borg.c.y,borg.c.x);
      lVar8 = (long)local_3c;
      lVar7 = (long)local_38;
      pcVar6 = format("# Guessing wall (%d,%d) near target (%d,%d)",(ulong)(uint)local_3c,
                      (ulong)(uint)local_38,(ulong)(uint)wVar4,x);
      borg_note(pcVar6);
      goto LAB_00240822;
    }
    borg_inc_motion(&local_3c,&local_38,borg.c.y,borg.c.x,local_34,x);
  } while( true );
}

Assistant:

bool borg_target_unknown_wall(int y, int x)
{
    int  n_x, n_y;
    bool found  = false;
    bool y_hall = false;
    bool x_hall = false;

    borg_grid           *ag;
    struct monster_race *r_ptr;
    borg_kill           *kill;

    borg_note(format("# Perhaps wall near targetted location (%d,%d)", y, x));

    /* Determine "path" */
    n_x = borg.c.x;
    n_y = borg.c.y;

    /* check for 'in a hall' x axis */
    /* This check is for this: */
    /*
     *      x        x
     *    ..@.  or  .@..
     *      x        x
     *
     * 'x' being 'not a floor' and '.' being a floor.
     *
     * We would like to know if in a hall so we can place
     * the suspect wall off the hallway path.
     * like this:######x  P
     * ........@....
     * ##################
     * The shot may miss and we want the borg to guess the
     * wall to be at the X instead of first unkown grid which
     * is 3 west and 1 south of the X.
     */

    if ((borg_grids[borg.c.y + 1][borg.c.x].feat == FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y + 2][borg.c.x].feat == FEAT_FLOOR
                || borg_grids[borg.c.y - 2][borg.c.x].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y][borg.c.x + 1].feat != FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat != FEAT_FLOOR))
        x_hall = true;

    /* check for 'in a hall' y axis.
     * Again, we want to place the suspected wall off our
     * hallway.
     */
    if ((borg_grids[borg.c.y][borg.c.x + 1].feat == FEAT_FLOOR
            && borg_grids[borg.c.y][borg.c.x - 1].feat == FEAT_FLOOR
            && (borg_grids[borg.c.y][borg.c.x + 2].feat == FEAT_FLOOR
                || borg_grids[borg.c.y][borg.c.x - 2].feat == FEAT_FLOOR))
        && (borg_grids[borg.c.y + 1][borg.c.x].feat != FEAT_FLOOR
            && borg_grids[borg.c.y - 1][borg.c.x].feat != FEAT_FLOOR))
        y_hall = true;

    while (1) {
        ag    = &borg_grids[n_y][n_x];
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
            borg_note(
                format("# Guessing wall (%d,%d) under ghostly target (%d,%d)",
                    n_y, n_x, n_y, n_x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here? */
        }

        if (borg_grids[n_y][n_x].feat == FEAT_NONE
            && ((n_y != borg.c.y) || !y_hall)
            && ((n_x != borg.c.x) || !x_hall)) {
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found); /* not sure... should we return here?
                             maybe should mark ALL unknowns in path... */
        }

        /* Pathway found the target. */
        if (n_x == x && n_y == y) {
            /* end of the pathway */
            borg_inc_motion(&n_y, &n_x, y, x, borg.c.y, borg.c.x);
            borg_note(format(
                "# Guessing wall (%d,%d) near target (%d,%d)", n_y, n_x, y, x));
            borg_grids[n_y][n_x].feat = FEAT_GRANITE;
            found                     = true;
            return (found);
        }

        /* Calculate the new location */
        borg_inc_motion(&n_y, &n_x, borg.c.y, borg.c.x, y, x);
    }
}